

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

char * String::findLastOf(char *in,char *chars)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strpbrk(in,chars);
  if (pcVar1 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    do {
      pcVar2 = pcVar1;
      pcVar1 = strpbrk(pcVar2 + 1,chars);
    } while (pcVar1 != (char *)0x0);
  }
  return pcVar2;
}

Assistant:

const char* String::findLastOf(const char* in, const char* chars)
{
  const char* result = 0;
  const char* match = strpbrk(in, chars);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strpbrk(match + 1, chars);
  }
}